

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O3

void ON_Font::GetRunBounds
               (ON_Font *font,wchar_t *text,double font_height_pixels,
               TextHorizontalAlignment horizontal_alignment,TextVerticalAlignment vertical_alignment
               ,ON_2dPoint *bounds_min,ON_2dPoint *bounds_max,int *line_count)

{
  ON_2dPoint OVar1;
  ON_2dPoint OVar2;
  ON_2dPoint OVar3;
  ON_2dPoint OVar4;
  double dVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  ON_FontGlyphCache *pOVar9;
  ON_FontMetrics *pOVar10;
  uint uVar11;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  double dVar12;
  ON_wString run;
  ON_2dPoint last_line_basepoint;
  ON_TextBox text_box;
  ON_2dVector local_b8;
  ON_wString local_a0;
  double local_98;
  undefined8 uStack_90;
  ON_2dPoint local_88;
  ON_TextBox local_78;
  double local_58;
  undefined8 uStack_50;
  undefined1 local_48 [16];
  
  local_48._8_4_ = in_XMM0_Dc;
  local_48._0_8_ = font_height_pixels;
  local_48._12_4_ = in_XMM0_Dd;
  *line_count = 0;
  dVar12 = ON_2dPoint::Origin.y;
  bounds_min->x = ON_2dPoint::Origin.x;
  bounds_min->y = dVar12;
  dVar12 = ON_2dPoint::Origin.y;
  bounds_max->x = ON_2dPoint::Origin.x;
  bounds_max->y = dVar12;
  ON_wString::ON_wString(&local_a0,text);
  iVar7 = ON_wString::Length(&local_a0);
  if (iVar7 < 1) goto LAB_00489601;
  if (font->m_runtime_serial_number == 0) {
    font = ON_ManagedFonts::GetFromFontCharacteristics(&ON_ManagedFonts::List,font,true);
  }
  if (font == (ON_Font *)0x0) {
    font = &Default;
  }
  pOVar9 = FontGlyphCache(font,false);
  if (pOVar9 == (ON_FontGlyphCache *)0x0) {
    pOVar10 = &ON_FontMetrics::Unset;
  }
  else {
    pOVar10 = &pOVar9->m_normalized_metrics;
  }
  uVar11 = (uint)pOVar10->m_ascent_of_capital;
  iVar7 = pOVar10->m_line_space;
  local_78.m_bbmin = ON_2dex::Unset;
  local_78.m_bbmax = ON_2dex::Unset;
  local_78.m_max_basepoint = ON_2dex::Zero;
  local_78.m_advance = ON_2dex::Zero;
  iVar8 = ON_FontGlyph::GetGlyphListBoundingBox(text,font,&local_78);
  *line_count = iVar8;
  if ((iVar8 < 0) || (bVar6 = ON_TextBox::IsSet(&local_78), !bVar6)) goto LAB_00489601;
  OVar1.y._0_4_ = SUB84((double)local_78.m_bbmin.j,0);
  OVar1.x = (double)local_78.m_bbmin.i;
  OVar1.y._4_4_ = (int)((ulong)(double)local_78.m_bbmin.j >> 0x20);
  *bounds_min = OVar1;
  OVar2.y._0_4_ = SUB84((double)local_78.m_bbmax.j,0);
  OVar2.x = (double)local_78.m_bbmax.i;
  OVar2.y._4_4_ = (int)((ulong)(double)local_78.m_bbmax.j >> 0x20);
  *bounds_max = OVar2;
  local_58 = ON_2dPoint::Origin.y;
  uStack_50 = 0;
  local_98 = ON_2dPoint::Origin.x;
  uStack_90 = 0;
  ON_2dPoint::ON_2dPoint(&local_88,ON_2dPoint::Origin.x,(double)((1 - *line_count) * iVar7));
  local_b8.x = ON_2dVector::ZeroVector.x;
  local_b8.y = ON_2dVector::ZeroVector.y;
  if (horizontal_alignment == Left) {
    local_b8.x = -local_98;
  }
  else if (horizontal_alignment == Center) {
    local_b8.x = (double)local_78.m_max_basepoint.i * -0.5 - local_98;
  }
  else if (horizontal_alignment == Right) {
    local_b8.x = -local_98 - (double)local_78.m_max_basepoint.i;
  }
  dVar12 = local_58;
  switch(vertical_alignment) {
  case Top:
    local_b8.y = -local_58 - (double)uVar11;
    break;
  case MiddleOfTop:
    local_b8.y = (double)uVar11 * -0.5 - local_58;
    break;
  case BottomOfTop:
    goto switchD_00489524_caseD_2;
  case Middle:
    local_b8.y = (double)(int)((*line_count + -1) * iVar7 + uVar11) * 0.5;
    goto LAB_0048956c;
  case MiddleOfBottom:
    local_b8.y = (double)uVar11 * -0.5;
LAB_0048956c:
    local_b8.y = local_b8.y - local_88.y;
    break;
  case Bottom:
    dVar12 = local_88.y;
    goto switchD_00489524_caseD_2;
  case BottomOfBoundingBox:
    dVar12 = bounds_min->y;
switchD_00489524_caseD_2:
    local_b8.y = -dVar12;
  }
  ON_2dPoint::operator+=(bounds_min,&local_b8);
  ON_2dPoint::operator+=(bounds_max,&local_b8);
  dVar12 = (double)local_48._0_8_ * 0.00390625;
  if (0.0 < dVar12) {
    dVar5 = (double)local_78.m_bbmin.j * dVar12;
    OVar3.y._0_4_ = SUB84(dVar5,0);
    OVar3.x = (double)local_78.m_bbmin.i * dVar12;
    OVar3.y._4_4_ = (int)((ulong)dVar5 >> 0x20);
    *bounds_min = OVar3;
    dVar5 = (double)local_78.m_bbmax.j * dVar12;
    OVar4.y._0_4_ = SUB84(dVar5,0);
    OVar4.x = (double)local_78.m_bbmax.i * dVar12;
    OVar4.y._4_4_ = (int)((ulong)dVar5 >> 0x20);
    *bounds_max = OVar4;
  }
LAB_00489601:
  ON_wString::~ON_wString(&local_a0);
  return;
}

Assistant:

void ON_Font::GetRunBounds(
  const ON_Font& font,
  const wchar_t* text,
  double font_height_pixels,
  ON::TextHorizontalAlignment horizontal_alignment,
  ON::TextVerticalAlignment vertical_alignment,
  ON_2dPoint& bounds_min,
  ON_2dPoint& bounds_max, 
  int& line_count
)
{
  line_count = 0;
  bounds_min = ON_2dPoint::Origin;
  bounds_max = ON_2dPoint::Origin;

  ON_wString run = text;
  int textlength = run.Length();
  if(textlength < 1)
    return;

  const ON_Font* managed_font = font.ManagedFont();
  if (nullptr == managed_font)
    managed_font = &ON_Font::Default;

  const ON_FontMetrics& fm = managed_font->FontMetrics();

  const int height_of_I = fm.AscentOfCapital();
  const int height_of_LF = fm.LineSpace();

  ON_TextBox text_box;
  line_count = ON_FontGlyph::GetGlyphListBoundingBox(text, managed_font, text_box);
  if ( line_count < 0 || false == text_box.IsSet())
    return;

  bounds_min.x = text_box.m_bbmin.i;
  bounds_min.y = text_box.m_bbmin.j;

  bounds_max.x = text_box.m_bbmax.i;
  bounds_max.y = text_box.m_bbmax.j;

  // in text_box coordinate system (0.0) = left most baseline point of first line.
  const ON_2dPoint first_line_basepoint = ON_2dPoint::Origin;
  const ON_2dPoint last_line_basepoint(first_line_basepoint.x, -(line_count - 1)*height_of_LF);

  ON_2dVector offset = ON_2dVector::ZeroVector;

  switch (horizontal_alignment)
  {
  case ON::TextHorizontalAlignment::Left:
    offset.x = -first_line_basepoint.x;
    break;

  case ON::TextHorizontalAlignment::Center:
    // Text command uses m_max_basepoint (not bbmax)
    offset.x = -first_line_basepoint.x - 0.5*text_box.m_max_basepoint.i;
    break;

  case ON::TextHorizontalAlignment::Right:
    // Text command uses m_max_basepoint (not bbmax)
    offset.x = -first_line_basepoint.x - text_box.m_max_basepoint.i;
    break;
  default:
    break;
  }

  switch (vertical_alignment)
  {
  case ON::TextVerticalAlignment::Top:
    // (*,0) is at the top of an "I" on the first line.
    offset.y = -first_line_basepoint.y - height_of_I;
    break;
  case ON::TextVerticalAlignment::MiddleOfTop:
    // (*,0) is at the middle of an "I" on the first line.
    offset.y = -first_line_basepoint.y - 0.5*height_of_I;
    break;
  case ON::TextVerticalAlignment::BottomOfTop:
    // (*,0) is at the baseline of the first line.
    offset.y = -first_line_basepoint.y;
    break;

  case ON::TextVerticalAlignment::Middle:
    {
      // (*,0) is the vertical middle of lines (not vertical middle of glyph bounding box)
      double h = (line_count - 1)*height_of_LF + height_of_I;
      offset.y = -last_line_basepoint.y + 0.5*h;
    }
    break;

  case ON::TextVerticalAlignment::MiddleOfBottom:
    // (*,0) is at the middle of an "I" on the last line.
    offset.y = -last_line_basepoint.y  - 0.5*height_of_I;
    break;
  case ON::TextVerticalAlignment::Bottom:
    // (*,0) is at the basline of the last line.
    offset.y = -last_line_basepoint.y;
    break;
  case ON::TextVerticalAlignment::BottomOfBoundingBox:
    // (*,0) is on the bottom the the glyphs' bounding box
    offset.y = -bounds_min.y;
    break;
  default:
    break;
  }

  bounds_min += offset;
  bounds_max += offset;

  // scale is applied last.
  const double scale = font_height_pixels / (double)ON_Font::Constants::AnnotationFontCellHeight;
  if (scale > 0.0)
  {
    bounds_min.x = scale * text_box.m_bbmin.i;
    bounds_max.x = scale * text_box.m_bbmax.i;
    bounds_min.y = scale * text_box.m_bbmin.j;
    bounds_max.y = scale * text_box.m_bbmax.j;
  }
}